

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::ClassDecl> __thiscall
mocker::Parser::classDecl(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  bool bVar1;
  __type _Var2;
  TokenID TVar3;
  pointer pTVar4;
  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
  _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  element_type *peVar6;
  element_type *this_01;
  mapped_type *pmVar7;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  shared_ptr<mocker::ast::ClassDecl> sVar9;
  Position beg;
  Position beg_00;
  Position beg_01;
  Position end_00;
  Position end_01;
  Position end_02;
  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
  local_240;
  pair<mocker::Position,_mocker::Position> local_238;
  size_t local_218;
  shared_ptr<mocker::ast::Identifier> *psStack_210;
  TokIter *local_208;
  size_t sStack_200;
  Token *local_1f0;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  local_1e8;
  size_t local_1c8;
  size_t sStack_1c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b8;
  size_t sStack_1b0;
  undefined1 local_1a0 [32];
  NodeID local_180;
  size_t local_178;
  shared_ptr<mocker::ast::Type> *psStack_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  size_t sStack_160;
  undefined1 local_150 [8];
  shared_ptr<mocker::ast::FuncDecl> ctor;
  undefined1 local_138 [8];
  shared_ptr<mocker::ast::CompoundStmt> body;
  pair<mocker::Position,_mocker::Position> ctorPos;
  int local_ec;
  undefined1 local_e0 [8];
  shared_ptr<mocker::ast::Declaration> member;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  members;
  undefined1 local_98 [8];
  shared_ptr<mocker::ast::Identifier> ident;
  undefined1 local_80 [8];
  anon_class_24_2_341b408a throwError;
  size_t local_60;
  Position begPos;
  GetTokenID local_30;
  GetTokenID id;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  id.end._M_current = (TokIter)(TokIter)end._M_current;
  this_local = (Parser *)in_RCX._M_current;
  end_local._M_current = (Token *)this;
  GetTokenID::GetTokenID(&local_30,in_RCX);
  pTVar4 = __gnu_cxx::
           __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
           ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                         *)id.end._M_current);
  Token::position((pair<mocker::Position,_mocker::Position> *)&throwError.iter,pTVar4);
  local_80 = (undefined1  [8])throwError.iter;
  throwError.begPos.col = (size_t)id.end._M_current;
  ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)id.end._M_current;
  TVar3 = GetTokenID::operator()
                    (&local_30,
                     (TokIter)ident.
                              super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
  if (TVar3 == Class) {
    __gnu_cxx::
    __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
    ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  *)id.end._M_current);
    identifier((Parser *)local_98,iter,id.end._M_current);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
    if (!bVar1) {
      classDecl::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)local_80);
    }
    _Var5 = __gnu_cxx::
            __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
            ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                          *)id.end._M_current,0);
    TVar3 = GetTokenID::operator()(&local_30,(TokIter)_Var5._M_current);
    if (TVar3 != LeftBrace) {
      classDecl::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)local_80);
    }
    std::
    vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
    ::vector((vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
              *)&member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    do {
      declaration((Parser *)local_e0,iter,id.end._M_current);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_e0);
      if (bVar1) {
        std::
        vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
        ::emplace_back<std::shared_ptr<mocker::ast::Declaration>&>
                  ((vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                    *)&member.
                       super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(shared_ptr<mocker::ast::Declaration> *)local_e0);
        local_ec = 2;
      }
      else {
        TVar3 = GetTokenID::operator()(&local_30,*id.end._M_current);
        if (TVar3 == Identifier) {
          _Var5 = __gnu_cxx::
                  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  ::operator+((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                               *)id.end._M_current,1);
          TVar3 = GetTokenID::operator()(&local_30,(TokIter)_Var5._M_current);
          if (TVar3 == LeftParen) {
            pTVar4 = __gnu_cxx::
                     __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                     ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                   *)id.end._M_current);
            __lhs = Token::val<std::__cxx11::string>(pTVar4);
            peVar6 = std::
                     __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_98);
            _Var2 = std::operator==(__lhs,&peVar6->val);
            if (_Var2) {
              ctorPos.second.col =
                   (size_t)__gnu_cxx::
                           __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                           ::operator+((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                        *)id.end._M_current,3);
              bVar1 = __gnu_cxx::operator>=
                                ((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                  *)&ctorPos.second.col,
                                 (__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                  *)&this_local);
              if (bVar1) {
                classDecl::anon_class_24_2_341b408a::operator()
                          ((anon_class_24_2_341b408a *)local_80);
              }
              pTVar4 = __gnu_cxx::
                       __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                       ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                     *)id.end._M_current);
              Token::position((pair<mocker::Position,_mocker::Position> *)
                              &body.
                               super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,pTVar4);
              __gnu_cxx::
              __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
              ::operator+=((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                            *)id.end._M_current,3);
              ctor.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_local;
              compoundStmt((Parser *)local_138,iter,id.end._M_current);
              bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_138);
              if (!bVar1) {
                classDecl::anon_class_24_2_341b408a::operator()
                          ((anon_class_24_2_341b408a *)local_80);
              }
              local_168 = body.
                          super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              sStack_160 = ctorPos.first.line;
              this_00 = iter[2]._M_current;
              this_01 = std::
                        __shared_ptr_access<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_138);
              local_180 = ast::ASTNode::getID((ASTNode *)this_01);
              pmVar7 = std::
                       unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                       ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                                     *)this_00,&local_180);
              local_178 = (pmVar7->second).line;
              psStack_170 = (shared_ptr<mocker::ast::Type> *)(pmVar7->second).col;
              std::shared_ptr<mocker::ast::Type>::shared_ptr
                        ((shared_ptr<mocker::ast::Type> *)(local_1a0 + 0x10),(nullptr_t)0x0);
              local_1b8 = body.
                          super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              sStack_1b0 = ctorPos.first.line;
              local_1c8 = ctorPos.first.col;
              sStack_1c0 = ctorPos.second.line;
              beg.col = (size_t)body.
                                super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
              beg.line = (size_t)iter;
              end_00.col = ctorPos.first.col;
              end_00.line = ctorPos.first.line;
              makeNode<mocker::ast::Identifier,char_const(&)[7]>
                        ((Parser *)local_1a0,beg,end_00,(char (*) [7])ctorPos.second.line);
              local_1e8.
              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1e8.
              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1e8.
              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ::vector(&local_1e8);
              beg_00.col = (size_t)local_168;
              beg_00.line = (size_t)iter;
              end_01.col = local_178;
              end_01.line = sStack_160;
              makeNode<mocker::ast::FuncDecl,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>,std::shared_ptr<mocker::ast::CompoundStmt>&>
                        ((Parser *)local_150,beg_00,end_01,psStack_170,
                         (shared_ptr<mocker::ast::Identifier> *)(local_1a0 + 0x10),
                         (vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                          *)local_1a0,(shared_ptr<mocker::ast::CompoundStmt> *)&local_1e8);
              std::
              vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ::~vector(&local_1e8);
              std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
                        ((shared_ptr<mocker::ast::Identifier> *)local_1a0);
              std::shared_ptr<mocker::ast::Type>::~shared_ptr
                        ((shared_ptr<mocker::ast::Type> *)(local_1a0 + 0x10));
              std::
              vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
              ::emplace_back<std::shared_ptr<mocker::ast::FuncDecl>&>
                        ((vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                          *)&member.
                             super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,(shared_ptr<mocker::ast::FuncDecl> *)local_150);
              local_ec = 2;
              std::shared_ptr<mocker::ast::FuncDecl>::~shared_ptr
                        ((shared_ptr<mocker::ast::FuncDecl> *)local_150);
              std::shared_ptr<mocker::ast::CompoundStmt>::~shared_ptr
                        ((shared_ptr<mocker::ast::CompoundStmt> *)local_138);
              goto LAB_0025990e;
            }
          }
        }
        local_ec = 3;
      }
LAB_0025990e:
      std::shared_ptr<mocker::ast::Declaration>::~shared_ptr
                ((shared_ptr<mocker::ast::Declaration> *)local_e0);
    } while (local_ec == 2);
    local_1f0 = *(Token **)id.end._M_current;
    TVar3 = GetTokenID::operator()(&local_30,(TokIter)local_1f0);
    if (TVar3 != RightBrace) {
      classDecl::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)local_80);
    }
    local_208 = throwError.iter;
    sStack_200 = local_60;
    local_240 = __gnu_cxx::
                __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                              *)id.end._M_current,0);
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
             ::operator->(&local_240);
    Token::position(&local_238,pTVar4);
    local_218 = local_238.second.line;
    psStack_210 = (shared_ptr<mocker::ast::Identifier> *)local_238.second.col;
    beg_01.col = (size_t)local_208;
    beg_01.line = (size_t)iter;
    end_02.col = local_238.second.line;
    end_02.line = sStack_200;
    makeNode<mocker::ast::ClassDecl,std::shared_ptr<mocker::ast::Identifier>&,std::vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>>
              (this,beg_01,end_02,(shared_ptr<mocker::ast::Identifier> *)local_238.second.col,
               (vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                *)local_98);
    std::
    vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
    ::~vector((vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
               *)&member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
              ((shared_ptr<mocker::ast::Identifier> *)local_98);
    _Var8._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<mocker::ast::ClassDecl>::shared_ptr
              ((shared_ptr<mocker::ast::ClassDecl> *)this,(nullptr_t)0x0);
    _Var8._M_pi = extraout_RDX;
  }
  sVar9.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar9.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::ClassDecl>)
         sVar9.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::ClassDecl> Parser::classDecl(TokIter &iter, TokIter end) {
  auto id = GetTokenID(end);
  auto begPos = iter->position().first;
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  if (id(iter) != TokenID::Class)
    return nullptr;
  ++iter;
  auto ident = identifier(iter, end);
  if (!ident)
    throwError();
  if (id(iter++) != TokenID::LeftBrace)
    throwError();
  std::vector<std::shared_ptr<ast::Declaration>> members;
  while (true) {
    auto member = declaration(iter, end);
    if (member) {
      members.emplace_back(member);
      continue;
    }
    // ctor
    if (id(iter) == TokenID::Identifier && id(iter + 1) == TokenID::LeftParen &&
        iter->val<std::string>() == ident->val) {
      if (iter + 3 >= end)
        throwError();
      auto ctorPos = iter->position();
      iter += 3;
      auto body = compoundStmt(iter, end);
      if (!body)
        throwError();
      auto ctor = makeNode<ast::FuncDecl>(
          ctorPos.first, pos[body->getID()].second,
          std::shared_ptr<ast::Type>(nullptr),
          makeNode<ast::Identifier>(ctorPos.first, ctorPos.second, "_ctor_"),
          std::vector<std::shared_ptr<ast::VarDeclStmt>>(), body);
      members.emplace_back(ctor);
      continue;
    }
    break;
  }
  if (id(iter) != TokenID::RightBrace)
    throwError();
  return makeNode<ast::ClassDecl>(begPos, (iter++)->position().second, ident,
                                  std::move(members));
}